

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTFragmentShader::configureProgram
          (TextureCubeMapArrayTextureSizeRTFragmentShader *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *local_28;
  char *fsCode;
  char *vsCode;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTFragmentShader *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  vsCode = (char *)CONCAT44(extraout_var,iVar2);
  fsCode = getVertexShaderCode(this);
  local_28 = getFragmentShaderCode(this);
  GVar3 = (**(code **)(vsCode + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(vsCode + 0x800))();
  glu::checkError(dVar4,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x536);
  GVar3 = (**(code **)(vsCode + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(vsCode + 0x800))();
  glu::checkError(dVar4,"Could not create shader object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x538);
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,
                     (this->super_TextureCubeMapArrayTextureSizeRTBase).
                     super_TextureCubeMapArrayTextureSizeBase.m_po_id,this->m_fs_id,1,&local_28,
                     this->m_vs_id,1,&fsCode,(bool *)0x0);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not compile/link program object from valid shader code.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
               ,0x53c);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTFragmentShader::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const char* vsCode = getVertexShaderCode();
	const char* fsCode = getFragmentShaderCode();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object.");

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
	{
		TCU_FAIL("Could not compile/link program object from valid shader code.");
	}
}